

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

void Assimp::Subdivide(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  uint uVar1;
  uint uVar2;
  pointer paVar3;
  aiVector3t<float> aVar4;
  aiVector3t<float> aVar5;
  aiVector3t<float> *paVar6;
  uint i;
  uint uVar7;
  float f;
  aiVector3t<float> aVar8;
  aiVector3t<float> local_a8;
  aiVector3t<float> local_98;
  aiVector3D c;
  aiVector3D b;
  aiVector3D a;
  aiVector3t<float> local_58;
  long local_48;
  aiVector3t<float> local_40;
  
  paVar3 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  f = SQRT(paVar3->z * paVar3->z + paVar3->x * paVar3->x + paVar3->y * paVar3->y);
  local_48 = ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)paVar3) / 0xc;
  for (uVar7 = 0; uVar7 < (uint)local_48; uVar7 = uVar7 + 3) {
    paVar3 = (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = uVar7 + 1;
    uVar2 = uVar7 + 2;
    a.z = paVar3[uVar7].z;
    a.x = paVar3[uVar7].x;
    a.y = paVar3[uVar7].y;
    b.z = paVar3[uVar1].z;
    b.x = paVar3[uVar1].x;
    b.y = paVar3[uVar1].y;
    c.z = paVar3[uVar2].z;
    c.x = paVar3[uVar2].x;
    c.y = paVar3[uVar2].y;
    local_98.y = b.y + a.y;
    local_98.x = b.x + a.x;
    local_98.z = a.z + b.z;
    paVar6 = aiVector3t<float>::Normalize(&local_98);
    local_58 = ::operator*(paVar6,f);
    local_a8.y = c.y + a.y;
    local_a8.x = c.x + a.x;
    local_a8.z = a.z + c.z;
    paVar6 = aiVector3t<float>::Normalize(&local_a8);
    local_98 = ::operator*(paVar6,f);
    local_40.z = b.z + c.z;
    local_40.x = c.x + b.x;
    local_40.y = c.y + b.y;
    paVar6 = aiVector3t<float>::Normalize(&local_40);
    aVar8 = ::operator*(paVar6,f);
    aVar5 = local_58;
    aVar4 = local_98;
    paVar3[uVar7].z = local_58.z;
    paVar3[uVar7].x = local_58.x;
    paVar3[uVar7].y = local_58.y;
    local_a8.z = aVar8.z;
    paVar3[uVar1].z = local_a8.z;
    local_a8._0_8_ = aVar8._0_8_;
    paVar3[uVar1].x = local_a8.x;
    paVar3[uVar1].y = local_a8.y;
    paVar3[uVar2].z = local_98.z;
    paVar3[uVar2].x = local_98.x;
    paVar3[uVar2].y = local_98.y;
    local_a8 = aVar8;
    local_98 = aVar4;
    local_58 = aVar5;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_98);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&a);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_98);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_a8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&c);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_a8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_58);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,&b);
  }
  return;
}

Assistant:

void Subdivide(std::vector<aiVector3D>& positions)
{
    // assume this to be constant - (fixme: must be 1.0? I think so)
    const ai_real fl1 = positions[0].Length();

    unsigned int origSize = (unsigned int)positions.size();
    for (unsigned int i = 0 ; i < origSize ; i+=3)
    {
        aiVector3D& tv0 = positions[i];
        aiVector3D& tv1 = positions[i+1];
        aiVector3D& tv2 = positions[i+2];

        aiVector3D a = tv0, b = tv1, c = tv2;
        aiVector3D v1 = aiVector3D(a.x+b.x, a.y+b.y, a.z+b.z).Normalize()*fl1;
        aiVector3D v2 = aiVector3D(a.x+c.x, a.y+c.y, a.z+c.z).Normalize()*fl1;
        aiVector3D v3 = aiVector3D(b.x+c.x, b.y+c.y, b.z+c.z).Normalize()*fl1;

        tv0 = v1; tv1 = v3; tv2 = v2; // overwrite the original
        ADD_TRIANGLE(v1, v2, a);
        ADD_TRIANGLE(v2, v3, c);
        ADD_TRIANGLE(v3, v1, b);
    }
}